

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,UInt u)

{
  int iVar1;
  DasmStyle *pDVar2;
  int iVar3;
  ulong value;
  double dVar4;
  
  value = (ulong)u.raw;
  pDVar2 = this->style;
  if ((pDVar2->numberFormat).radix == '\n') {
    sprintd(&this->ptr,value);
  }
  else {
    if (u.raw == 0) {
      iVar3 = 1;
    }
    else {
      dVar4 = log2((double)value);
      iVar1 = (int)dVar4 + 4;
      iVar3 = (int)dVar4 + 7;
      if (-1 < iVar1) {
        iVar3 = iVar1;
      }
      iVar3 = iVar3 >> 2;
    }
    sprintx(&this->ptr,value,&pDVar2->numberFormat,iVar3);
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(UInt u)
{
    sprint(ptr, u.raw, style.numberFormat);
    return *this;
}